

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

string * __thiscall
ICM::to_string<6ul>(string *__return_storage_ptr__,ICM *this,ConstDataPointer data)

{
  Common::Convert::to_string_abi_cxx11_
            (__return_storage_ptr__,(Convert *)(ulong)(byte)*this,SUB81(data,0));
  return __return_storage_ptr__;
}

Assistant:

string to_string(ConstDataPointer data) {
		using std::to_string;
		using Common::Convert::to_string;
		using TypeBase::to_string;
		return to_string(*get<_TU>((void*)data));
	}